

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t archive_acl_parse_l(archive_acl *acl,char *text,wchar_t default_type,archive_string_conv *sc
                           )

{
  int iVar1;
  wchar_t wVar2;
  char *in_RCX;
  undefined4 in_EDX;
  char *in_RSI;
  char *end;
  char *start;
  char sep;
  wchar_t id;
  wchar_t permset;
  wchar_t tag;
  wchar_t type;
  wchar_t ret;
  wchar_t r;
  wchar_t n;
  wchar_t fields;
  anon_struct_16_2_267fbce2 name;
  anon_struct_16_2_267fbce2 field [4];
  wchar_t in_stack_ffffffffffffff48;
  wchar_t in_stack_ffffffffffffff4c;
  wchar_t in_stack_ffffffffffffff50;
  wchar_t in_stack_ffffffffffffff54;
  archive_acl *in_stack_ffffffffffffff58;
  char local_99;
  wchar_t local_98;
  wchar_t local_94;
  undefined4 uVar3;
  undefined4 uVar4;
  wchar_t wVar5;
  wchar_t in_stack_ffffffffffffff7c;
  int local_80;
  int local_7c;
  char *local_68 [4];
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  undefined4 local_1c;
  char *local_18 [3];
  
  wVar5 = L'\0';
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18[0] = in_RSI;
  do {
    wVar2 = in_stack_ffffffffffffff4c & 0xffffff;
    if (local_18[0] != (char *)0x0) {
      wVar2 = CONCAT13(*local_18[0] != '\0',(int3)in_stack_ffffffffffffff4c);
    }
    in_stack_ffffffffffffff4c = wVar2;
    if ((char)((uint)in_stack_ffffffffffffff4c >> 0x18) == '\0') {
      return wVar5;
    }
    local_7c = 0;
    do {
      next_field(local_18,(char **)&stack0xffffffffffffff58,(char **)&stack0xffffffffffffff50,
                 &local_99);
      if (local_7c < 4) {
        local_68[(long)local_7c * 2] = (char *)in_stack_ffffffffffffff58;
        local_68[(long)local_7c * 2 + 1] =
             (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      }
      local_7c = local_7c + 1;
      local_80 = local_7c;
    } while (local_99 == ':');
    for (; local_80 < 4; local_80 = local_80 + 1) {
      local_68[(long)local_80 * 2 + 1] = (char *)0x0;
      local_68[(long)local_80 * 2] = (char *)0x0;
    }
    local_98 = L'\xffffffff';
    isint(local_68[2],local_68[3],&local_98);
    if ((local_98 == L'\xffffffff') && (3 < local_7c)) {
      isint(local_38,local_30,&local_98);
    }
    uVar4 = local_1c;
    if ((7 < (long)local_68[1] - (long)local_68[0]) &&
       (iVar1 = memcmp(local_68[0],"default",7), uVar4 = local_1c, iVar1 == 0)) {
      local_68[0] = local_68[0] + 7;
      uVar4 = 0x200;
    }
    wVar2 = prefix_c(local_68[0],local_68[1],"user");
    if (wVar2 == L'\0') {
      wVar2 = prefix_c(local_68[0],local_68[1],"group");
      if (wVar2 == L'\0') {
        wVar2 = prefix_c(local_68[0],local_68[1],"other");
        if (wVar2 == L'\0') {
          wVar2 = prefix_c(local_68[0],local_68[1],"mask");
          if (wVar2 == L'\0') {
            return L'\xffffffec';
          }
          if ((((local_7c != 2) || (local_68[3] <= local_68[2])) ||
              (wVar2 = ismode(local_68[2],local_68[3],&local_94), wVar2 == L'\0')) &&
             (((local_7c != 3 || (local_68[2] != local_68[3])) ||
              ((local_40 <= local_48 ||
               (wVar2 = ismode(local_48,local_40,&local_94), wVar2 == L'\0')))))) {
            return L'\xffffffec';
          }
          uVar3 = 0x2715;
        }
        else {
          if ((((local_7c != 2) || (local_68[3] <= local_68[2])) ||
              (wVar2 = ismode(local_68[2],local_68[3],&local_94), wVar2 == L'\0')) &&
             ((((local_7c != 3 || (local_68[2] != local_68[3])) || (local_40 <= local_48)) ||
              (wVar2 = ismode(local_48,local_40,&local_94), wVar2 == L'\0')))) {
            return L'\xffffffec';
          }
          uVar3 = 0x2716;
        }
      }
      else {
        wVar2 = ismode(local_48,local_40,&local_94);
        if (wVar2 == L'\0') {
          return L'\xffffffec';
        }
        if ((local_98 == L'\xffffffff') && (local_68[3] <= local_68[2])) {
          uVar3 = 0x2714;
        }
        else {
          uVar3 = 0x2713;
        }
      }
    }
    else {
      wVar2 = ismode(local_48,local_40,&local_94);
      if (wVar2 == L'\0') {
        return L'\xffffffec';
      }
      if ((local_98 == L'\xffffffff') && (local_68[3] <= local_68[2])) {
        uVar3 = 0x2712;
      }
      else {
        uVar3 = 0x2711;
      }
    }
    in_stack_ffffffffffffff7c =
         archive_acl_add_entry_len_l
                   (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,
                    in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,local_28,
                    CONCAT44(uVar4,uVar3),
                    (archive_string_conv *)CONCAT44(in_stack_ffffffffffffff7c,wVar5));
    if (in_stack_ffffffffffffff7c < L'\xffffffec') {
      return in_stack_ffffffffffffff7c;
    }
    if (in_stack_ffffffffffffff7c != L'\0') {
      wVar5 = L'\xffffffec';
    }
  } while( true );
}

Assistant:

int
archive_acl_parse_l(struct archive_acl *acl,
    const char *text, int default_type, struct archive_string_conv *sc)
{
	struct {
		const char *start;
		const char *end;
	} field[4], name;

	int fields, n, r, ret = ARCHIVE_OK;
	int type, tag, permset, id;
	char sep;

	while (text != NULL  &&  *text != '\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const char *start, *end;
			next_field(&text, &start, &end, &sep);
			if (fields < 4) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == ':');

		/* Set remaining fields to blank. */
		for (n = fields; n < 4; ++n)
			field[n].start = field[n].end = NULL;

		/* Check for a numeric ID in field 1 or 3. */
		id = -1;
		isint(field[1].start, field[1].end, &id);
		/* Field 3 is optional. */
		if (id == -1 && fields > 3)
			isint(field[3].start, field[3].end, &id);

		/*
		 * Solaris extension:  "defaultuser::rwx" is the
		 * default ACL corresponding to "user::rwx", etc.
		 */
		if (field[0].end - field[0].start > 7
		    && memcmp(field[0].start, "default", 7) == 0) {
			type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
			field[0].start += 7;
		} else
			type = default_type;

		name.start = name.end = NULL;
		if (prefix_c(field[0].start, field[0].end, "user")) {
			if (!ismode(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_USER;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
		} else if (prefix_c(field[0].start, field[0].end, "group")) {
			if (!ismode(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_GROUP;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
		} else if (prefix_c(field[0].start, field[0].end, "other")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "other:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "other::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_OTHER;
		} else if (prefix_c(field[0].start, field[0].end, "mask")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "mask:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "mask::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_MASK;
		} else
			return (ARCHIVE_WARN);

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_len_l(acl, type, permset,
		    tag, id, name.start, name.end - name.start, sc);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
	}
	return (ret);
}